

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::DescriptorDatabaseTest_FindFileContainingSymbol_Test::TestBody
          (DescriptorDatabaseTest_FindFileContainingSymbol_Test *this)

{
  DescriptorDatabase *pDVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  string *psVar5;
  char *in_R9;
  string local_12b0;
  AssertHelper local_1290;
  Message local_1288;
  allocator<char> local_1279;
  string local_1278 [39];
  bool local_1251;
  undefined1 local_1250 [8];
  AssertionResult gtest_ar__12;
  FileDescriptorProto file_11;
  AssertHelper local_1128;
  Message local_1120;
  allocator<char> local_1111;
  string local_1110 [39];
  bool local_10e9;
  undefined1 local_10e8 [8];
  AssertionResult gtest_ar__11;
  FileDescriptorProto file_10;
  Message local_fd8;
  undefined1 local_fd0 [8];
  AssertionResult gtest_ar_9;
  AssertHelper local_fa0;
  Message local_f98;
  allocator<char> local_f89;
  string local_f88 [39];
  bool local_f61;
  undefined1 local_f60 [8];
  AssertionResult gtest_ar__10;
  FileDescriptorProto file_9;
  Message local_e50;
  undefined1 local_e48 [8];
  AssertionResult gtest_ar_8;
  AssertHelper local_e18;
  Message local_e10;
  allocator<char> local_e01;
  string local_e00 [39];
  bool local_dd9;
  undefined1 local_dd8 [8];
  AssertionResult gtest_ar__9;
  FileDescriptorProto file_8;
  Message local_cc8;
  undefined1 local_cc0 [8];
  AssertionResult gtest_ar_7;
  AssertHelper local_c90;
  Message local_c88;
  allocator<char> local_c79;
  string local_c78 [39];
  bool local_c51;
  undefined1 local_c50 [8];
  AssertionResult gtest_ar__8;
  FileDescriptorProto file_7;
  Message local_b40;
  undefined1 local_b38 [8];
  AssertionResult gtest_ar_6;
  AssertHelper local_b08;
  Message local_b00;
  allocator<char> local_af1;
  string local_af0 [39];
  bool local_ac9;
  undefined1 local_ac8 [8];
  AssertionResult gtest_ar__7;
  FileDescriptorProto file_6;
  Message local_9b8;
  undefined1 local_9b0 [8];
  AssertionResult gtest_ar_5;
  AssertHelper local_980;
  Message local_978;
  allocator<char> local_969;
  string local_968 [39];
  bool local_941;
  undefined1 local_940 [8];
  AssertionResult gtest_ar__6;
  FileDescriptorProto file_5;
  Message local_830;
  undefined1 local_828 [8];
  AssertionResult gtest_ar_4;
  AssertHelper local_7f8;
  Message local_7f0;
  allocator<char> local_7e1;
  string local_7e0 [39];
  bool local_7b9;
  undefined1 local_7b8 [8];
  AssertionResult gtest_ar__5;
  FileDescriptorProto file_4;
  Message local_6a8;
  undefined1 local_6a0 [8];
  AssertionResult gtest_ar_3;
  AssertHelper local_670;
  Message local_668;
  allocator<char> local_659;
  string local_658 [39];
  bool local_631;
  undefined1 local_630 [8];
  AssertionResult gtest_ar__4;
  FileDescriptorProto file_3;
  Message local_520;
  undefined1 local_518 [8];
  AssertionResult gtest_ar_2;
  AssertHelper local_4e8;
  Message local_4e0;
  allocator<char> local_4d1;
  string local_4d0 [39];
  bool local_4a9;
  undefined1 local_4a8 [8];
  AssertionResult gtest_ar__3;
  FileDescriptorProto file_2;
  AssertHelper local_380;
  Message local_378;
  allocator<char> local_369;
  string local_368 [39];
  bool local_341;
  undefined1 local_340 [8];
  AssertionResult gtest_ar__2;
  Message local_328;
  undefined1 local_320 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_2f0;
  Message local_2e8;
  allocator<char> local_2d9;
  string local_2d8 [39];
  bool local_2b1;
  undefined1 local_2b0 [8];
  AssertionResult gtest_ar__1;
  FileDescriptorProto file_1;
  Message local_1a0;
  undefined1 local_198 [8];
  AssertionResult gtest_ar;
  AssertHelper local_168;
  Message local_160 [3];
  allocator<char> local_141;
  string local_140 [39];
  bool local_119;
  undefined1 local_118 [8];
  AssertionResult gtest_ar_;
  FileDescriptorProto file;
  DescriptorDatabaseTest_FindFileContainingSymbol_Test *this_local;
  
  DescriptorDatabaseTest::AddToDatabase
            (&this->super_DescriptorDatabaseTest,
             "name: \"foo.proto\" message_type {   name: \"Foo\"   field { name:\"qux\" }  nested_type { name: \"Grault\" }   enum_type { name: \"Garply\" } } enum_type {   name: \"Waldo\"   value { name:\"FRED\" } } extension { name: \"plugh\" } service {   name: \"Xyzzy\"   method { name: \"Thud\" } }"
            );
  DescriptorDatabaseTest::AddToDatabase
            (&this->super_DescriptorDatabaseTest,
             "name: \"bar.proto\" package: \"corge\" message_type { name: \"Bar\" }");
  FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)&gtest_ar_.message_);
  pDVar1 = (this->super_DescriptorDatabaseTest).database_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_140,"Foo",&local_141);
  iVar3 = (*pDVar1->_vptr_DescriptorDatabase[3])(pDVar1,local_140,&gtest_ar_.message_);
  local_119 = (bool)((byte)iVar3 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_118,&local_119,(type *)0x0);
  std::__cxx11::string::~string(local_140);
  std::allocator<char>::~allocator(&local_141);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_118);
  if (!bVar2) {
    testing::Message::Message(local_160);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar.message_,(internal *)local_118,
               (AssertionResult *)"database_->FindFileContainingSymbol(\"Foo\", &file)","false",
               "true",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_168,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database_unittest.cc"
               ,0xcd,pcVar4);
    testing::internal::AssertHelper::operator=(&local_168,local_160);
    testing::internal::AssertHelper::~AssertHelper(&local_168);
    std::__cxx11::string::~string((string *)&gtest_ar.message_);
    testing::Message::~Message(local_160);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_118);
  psVar5 = FileDescriptorProto::name_abi_cxx11_((FileDescriptorProto *)&gtest_ar_.message_);
  testing::internal::EqHelper::
  Compare<char[10],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_198,"\"foo.proto\"","file.name()",(char (*) [10])0x1e1d402,psVar5);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_198);
  if (!bVar2) {
    testing::Message::Message(&local_1a0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_198);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)((long)&file_1.field_0 + 0xe0),kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database_unittest.cc"
               ,0xce,pcVar4);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)((long)&file_1.field_0 + 0xe0),&local_1a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)((long)&file_1.field_0 + 0xe0));
    testing::Message::~Message(&local_1a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_198);
  FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)&gtest_ar_.message_);
  FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)&gtest_ar__1.message_);
  pDVar1 = (this->super_DescriptorDatabaseTest).database_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2d8,"Foo.qux",&local_2d9);
  iVar3 = (*pDVar1->_vptr_DescriptorDatabase[3])(pDVar1,local_2d8,&gtest_ar__1.message_);
  local_2b1 = (bool)((byte)iVar3 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_2b0,&local_2b1,(type *)0x0);
  std::__cxx11::string::~string(local_2d8);
  std::allocator<char>::~allocator(&local_2d9);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2b0);
  if (!bVar2) {
    testing::Message::Message(&local_2e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_1.message_,(internal *)local_2b0,
               (AssertionResult *)"database_->FindFileContainingSymbol(\"Foo.qux\", &file)","false",
               "true",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_2f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database_unittest.cc"
               ,0xd4,pcVar4);
    testing::internal::AssertHelper::operator=(&local_2f0,&local_2e8);
    testing::internal::AssertHelper::~AssertHelper(&local_2f0);
    std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_2e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2b0);
  psVar5 = FileDescriptorProto::name_abi_cxx11_((FileDescriptorProto *)&gtest_ar__1.message_);
  testing::internal::EqHelper::
  Compare<char[10],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_320,"\"foo.proto\"","file.name()",(char (*) [10])0x1e1d402,psVar5);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_320);
  if (!bVar2) {
    testing::Message::Message(&local_328);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_320);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database_unittest.cc"
               ,0xd5,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__2.message_,&local_328);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__2.message_);
    testing::Message::~Message(&local_328);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_320);
  pDVar1 = (this->super_DescriptorDatabaseTest).database_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_368,"Foo.none_field.none",&local_369);
  iVar3 = (*pDVar1->_vptr_DescriptorDatabase[3])(pDVar1,local_368,&gtest_ar__1.message_);
  local_341 = (bool)((byte)iVar3 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_340,&local_341,(type *)0x0);
  std::__cxx11::string::~string(local_368);
  std::allocator<char>::~allocator(&local_369);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_340);
  if (!bVar2) {
    testing::Message::Message(&local_378);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)((long)&file_2.field_0 + 0xe0),(internal *)local_340,
               (AssertionResult *)
               "database_->FindFileContainingSymbol(\"Foo.none_field.none\", &file)","false","true",
               in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_380,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database_unittest.cc"
               ,0xd9,pcVar4);
    testing::internal::AssertHelper::operator=(&local_380,&local_378);
    testing::internal::AssertHelper::~AssertHelper(&local_380);
    std::__cxx11::string::~string((string *)((long)&file_2.field_0 + 0xe0));
    testing::Message::~Message(&local_378);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_340);
  FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)&gtest_ar__1.message_);
  FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)&gtest_ar__3.message_);
  pDVar1 = (this->super_DescriptorDatabaseTest).database_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_4d0,"Foo.Grault",&local_4d1);
  iVar3 = (*pDVar1->_vptr_DescriptorDatabase[3])(pDVar1,local_4d0,&gtest_ar__3.message_);
  local_4a9 = (bool)((byte)iVar3 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_4a8,&local_4a9,(type *)0x0);
  std::__cxx11::string::~string(local_4d0);
  std::allocator<char>::~allocator(&local_4d1);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4a8);
  if (!bVar2) {
    testing::Message::Message(&local_4e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_2.message_,(internal *)local_4a8,
               (AssertionResult *)"database_->FindFileContainingSymbol(\"Foo.Grault\", &file)",
               "false","true",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_4e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database_unittest.cc"
               ,0xdf,pcVar4);
    testing::internal::AssertHelper::operator=(&local_4e8,&local_4e0);
    testing::internal::AssertHelper::~AssertHelper(&local_4e8);
    std::__cxx11::string::~string((string *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_4e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4a8);
  psVar5 = FileDescriptorProto::name_abi_cxx11_((FileDescriptorProto *)&gtest_ar__3.message_);
  testing::internal::EqHelper::
  Compare<char[10],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_518,"\"foo.proto\"","file.name()",(char (*) [10])0x1e1d402,psVar5);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_518);
  if (!bVar2) {
    testing::Message::Message(&local_520);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_518);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)((long)&file_3.field_0 + 0xe0),kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database_unittest.cc"
               ,0xe0,pcVar4);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)((long)&file_3.field_0 + 0xe0),&local_520);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)((long)&file_3.field_0 + 0xe0));
    testing::Message::~Message(&local_520);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_518);
  FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)&gtest_ar__3.message_);
  FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)&gtest_ar__4.message_);
  pDVar1 = (this->super_DescriptorDatabaseTest).database_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_658,"Foo.Garply",&local_659);
  iVar3 = (*pDVar1->_vptr_DescriptorDatabase[3])(pDVar1,local_658,&gtest_ar__4.message_);
  local_631 = (bool)((byte)iVar3 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_630,&local_631,(type *)0x0);
  std::__cxx11::string::~string(local_658);
  std::allocator<char>::~allocator(&local_659);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_630);
  if (!bVar2) {
    testing::Message::Message(&local_668);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_3.message_,(internal *)local_630,
               (AssertionResult *)"database_->FindFileContainingSymbol(\"Foo.Garply\", &file)",
               "false","true",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_670,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database_unittest.cc"
               ,0xe6,pcVar4);
    testing::internal::AssertHelper::operator=(&local_670,&local_668);
    testing::internal::AssertHelper::~AssertHelper(&local_670);
    std::__cxx11::string::~string((string *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_668);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_630);
  psVar5 = FileDescriptorProto::name_abi_cxx11_((FileDescriptorProto *)&gtest_ar__4.message_);
  testing::internal::EqHelper::
  Compare<char[10],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_6a0,"\"foo.proto\"","file.name()",(char (*) [10])0x1e1d402,psVar5);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6a0);
  if (!bVar2) {
    testing::Message::Message(&local_6a8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_6a0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)((long)&file_4.field_0 + 0xe0),kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database_unittest.cc"
               ,0xe7,pcVar4);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)((long)&file_4.field_0 + 0xe0),&local_6a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)((long)&file_4.field_0 + 0xe0));
    testing::Message::~Message(&local_6a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_6a0);
  FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)&gtest_ar__4.message_);
  FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)&gtest_ar__5.message_);
  pDVar1 = (this->super_DescriptorDatabaseTest).database_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_7e0,"Waldo",&local_7e1);
  iVar3 = (*pDVar1->_vptr_DescriptorDatabase[3])(pDVar1,local_7e0,&gtest_ar__5.message_);
  local_7b9 = (bool)((byte)iVar3 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_7b8,&local_7b9,(type *)0x0);
  std::__cxx11::string::~string(local_7e0);
  std::allocator<char>::~allocator(&local_7e1);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7b8);
  if (!bVar2) {
    testing::Message::Message(&local_7f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_4.message_,(internal *)local_7b8,
               (AssertionResult *)"database_->FindFileContainingSymbol(\"Waldo\", &file)","false",
               "true",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_7f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database_unittest.cc"
               ,0xed,pcVar4);
    testing::internal::AssertHelper::operator=(&local_7f8,&local_7f0);
    testing::internal::AssertHelper::~AssertHelper(&local_7f8);
    std::__cxx11::string::~string((string *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_7f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_7b8);
  psVar5 = FileDescriptorProto::name_abi_cxx11_((FileDescriptorProto *)&gtest_ar__5.message_);
  testing::internal::EqHelper::
  Compare<char[10],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_828,"\"foo.proto\"","file.name()",(char (*) [10])0x1e1d402,psVar5);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_828);
  if (!bVar2) {
    testing::Message::Message(&local_830);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_828);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)((long)&file_5.field_0 + 0xe0),kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database_unittest.cc"
               ,0xee,pcVar4);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)((long)&file_5.field_0 + 0xe0),&local_830);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)((long)&file_5.field_0 + 0xe0));
    testing::Message::~Message(&local_830);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_828);
  FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)&gtest_ar__5.message_);
  FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)&gtest_ar__6.message_);
  pDVar1 = (this->super_DescriptorDatabaseTest).database_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_968,"Waldo.FRED",&local_969);
  iVar3 = (*pDVar1->_vptr_DescriptorDatabase[3])(pDVar1,local_968,&gtest_ar__6.message_);
  local_941 = (bool)((byte)iVar3 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_940,&local_941,(type *)0x0);
  std::__cxx11::string::~string(local_968);
  std::allocator<char>::~allocator(&local_969);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_940);
  if (!bVar2) {
    testing::Message::Message(&local_978);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_5.message_,(internal *)local_940,
               (AssertionResult *)"database_->FindFileContainingSymbol(\"Waldo.FRED\", &file)",
               "false","true",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_980,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database_unittest.cc"
               ,0xf4,pcVar4);
    testing::internal::AssertHelper::operator=(&local_980,&local_978);
    testing::internal::AssertHelper::~AssertHelper(&local_980);
    std::__cxx11::string::~string((string *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_978);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_940);
  psVar5 = FileDescriptorProto::name_abi_cxx11_((FileDescriptorProto *)&gtest_ar__6.message_);
  testing::internal::EqHelper::
  Compare<char[10],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_9b0,"\"foo.proto\"","file.name()",(char (*) [10])0x1e1d402,psVar5);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_9b0);
  if (!bVar2) {
    testing::Message::Message(&local_9b8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_9b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)((long)&file_6.field_0 + 0xe0),kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database_unittest.cc"
               ,0xf5,pcVar4);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)((long)&file_6.field_0 + 0xe0),&local_9b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)((long)&file_6.field_0 + 0xe0));
    testing::Message::~Message(&local_9b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_9b0);
  FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)&gtest_ar__6.message_);
  FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)&gtest_ar__7.message_);
  pDVar1 = (this->super_DescriptorDatabaseTest).database_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_af0,"plugh",&local_af1);
  iVar3 = (*pDVar1->_vptr_DescriptorDatabase[3])(pDVar1,local_af0,&gtest_ar__7.message_);
  local_ac9 = (bool)((byte)iVar3 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_ac8,&local_ac9,(type *)0x0);
  std::__cxx11::string::~string(local_af0);
  std::allocator<char>::~allocator(&local_af1);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ac8);
  if (!bVar2) {
    testing::Message::Message(&local_b00);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_6.message_,(internal *)local_ac8,
               (AssertionResult *)"database_->FindFileContainingSymbol(\"plugh\", &file)","false",
               "true",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_b08,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database_unittest.cc"
               ,0xfb,pcVar4);
    testing::internal::AssertHelper::operator=(&local_b08,&local_b00);
    testing::internal::AssertHelper::~AssertHelper(&local_b08);
    std::__cxx11::string::~string((string *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_b00);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_ac8);
  psVar5 = FileDescriptorProto::name_abi_cxx11_((FileDescriptorProto *)&gtest_ar__7.message_);
  testing::internal::EqHelper::
  Compare<char[10],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_b38,"\"foo.proto\"","file.name()",(char (*) [10])0x1e1d402,psVar5);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b38);
  if (!bVar2) {
    testing::Message::Message(&local_b40);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_b38);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)((long)&file_7.field_0 + 0xe0),kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database_unittest.cc"
               ,0xfc,pcVar4);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)((long)&file_7.field_0 + 0xe0),&local_b40);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)((long)&file_7.field_0 + 0xe0));
    testing::Message::~Message(&local_b40);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b38);
  FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)&gtest_ar__7.message_);
  FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)&gtest_ar__8.message_);
  pDVar1 = (this->super_DescriptorDatabaseTest).database_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_c78,"Xyzzy",&local_c79);
  iVar3 = (*pDVar1->_vptr_DescriptorDatabase[3])(pDVar1,local_c78,&gtest_ar__8.message_);
  local_c51 = (bool)((byte)iVar3 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_c50,&local_c51,(type *)0x0);
  std::__cxx11::string::~string(local_c78);
  std::allocator<char>::~allocator(&local_c79);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c50);
  if (!bVar2) {
    testing::Message::Message(&local_c88);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_7.message_,(internal *)local_c50,
               (AssertionResult *)"database_->FindFileContainingSymbol(\"Xyzzy\", &file)","false",
               "true",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_c90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database_unittest.cc"
               ,0x102,pcVar4);
    testing::internal::AssertHelper::operator=(&local_c90,&local_c88);
    testing::internal::AssertHelper::~AssertHelper(&local_c90);
    std::__cxx11::string::~string((string *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_c88);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c50);
  psVar5 = FileDescriptorProto::name_abi_cxx11_((FileDescriptorProto *)&gtest_ar__8.message_);
  testing::internal::EqHelper::
  Compare<char[10],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_cc0,"\"foo.proto\"","file.name()",(char (*) [10])0x1e1d402,psVar5);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_cc0);
  if (!bVar2) {
    testing::Message::Message(&local_cc8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_cc0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)((long)&file_8.field_0 + 0xe0),kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database_unittest.cc"
               ,0x103,pcVar4);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)((long)&file_8.field_0 + 0xe0),&local_cc8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)((long)&file_8.field_0 + 0xe0));
    testing::Message::~Message(&local_cc8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_cc0);
  FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)&gtest_ar__8.message_);
  FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)&gtest_ar__9.message_);
  pDVar1 = (this->super_DescriptorDatabaseTest).database_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_e00,"Xyzzy.Thud",&local_e01);
  iVar3 = (*pDVar1->_vptr_DescriptorDatabase[3])(pDVar1,local_e00,&gtest_ar__9.message_);
  local_dd9 = (bool)((byte)iVar3 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_dd8,&local_dd9,(type *)0x0);
  std::__cxx11::string::~string(local_e00);
  std::allocator<char>::~allocator(&local_e01);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_dd8);
  if (!bVar2) {
    testing::Message::Message(&local_e10);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_8.message_,(internal *)local_dd8,
               (AssertionResult *)"database_->FindFileContainingSymbol(\"Xyzzy.Thud\", &file)",
               "false","true",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_e18,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database_unittest.cc"
               ,0x109,pcVar4);
    testing::internal::AssertHelper::operator=(&local_e18,&local_e10);
    testing::internal::AssertHelper::~AssertHelper(&local_e18);
    std::__cxx11::string::~string((string *)&gtest_ar_8.message_);
    testing::Message::~Message(&local_e10);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_dd8);
  psVar5 = FileDescriptorProto::name_abi_cxx11_((FileDescriptorProto *)&gtest_ar__9.message_);
  testing::internal::EqHelper::
  Compare<char[10],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_e48,"\"foo.proto\"","file.name()",(char (*) [10])0x1e1d402,psVar5);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e48);
  if (!bVar2) {
    testing::Message::Message(&local_e50);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_e48);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)((long)&file_9.field_0 + 0xe0),kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database_unittest.cc"
               ,0x10a,pcVar4);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)((long)&file_9.field_0 + 0xe0),&local_e50);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)((long)&file_9.field_0 + 0xe0));
    testing::Message::~Message(&local_e50);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e48);
  FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)&gtest_ar__9.message_);
  FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)&gtest_ar__10.message_);
  pDVar1 = (this->super_DescriptorDatabaseTest).database_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_f88,"corge.Bar",&local_f89);
  iVar3 = (*pDVar1->_vptr_DescriptorDatabase[3])(pDVar1,local_f88,&gtest_ar__10.message_);
  local_f61 = (bool)((byte)iVar3 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_f60,&local_f61,(type *)0x0);
  std::__cxx11::string::~string(local_f88);
  std::allocator<char>::~allocator(&local_f89);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f60);
  if (!bVar2) {
    testing::Message::Message(&local_f98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_9.message_,(internal *)local_f60,
               (AssertionResult *)"database_->FindFileContainingSymbol(\"corge.Bar\", &file)",
               "false","true",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_fa0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database_unittest.cc"
               ,0x110,pcVar4);
    testing::internal::AssertHelper::operator=(&local_fa0,&local_f98);
    testing::internal::AssertHelper::~AssertHelper(&local_fa0);
    std::__cxx11::string::~string((string *)&gtest_ar_9.message_);
    testing::Message::~Message(&local_f98);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f60);
  psVar5 = FileDescriptorProto::name_abi_cxx11_((FileDescriptorProto *)&gtest_ar__10.message_);
  testing::internal::EqHelper::
  Compare<char[10],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_fd0,"\"bar.proto\"","file.name()",(char (*) [10])0x1e1d7ee,psVar5);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_fd0);
  if (!bVar2) {
    testing::Message::Message(&local_fd8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_fd0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)((long)&file_10.field_0 + 0xe0),kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database_unittest.cc"
               ,0x111,pcVar4);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)((long)&file_10.field_0 + 0xe0),&local_fd8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)((long)&file_10.field_0 + 0xe0));
    testing::Message::~Message(&local_fd8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_fd0);
  FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)&gtest_ar__10.message_);
  FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)&gtest_ar__11.message_);
  pDVar1 = (this->super_DescriptorDatabaseTest).database_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1110,"Baz",&local_1111);
  iVar3 = (*pDVar1->_vptr_DescriptorDatabase[3])(pDVar1,local_1110,&gtest_ar__11.message_);
  local_10e9 = (bool)(~(byte)iVar3 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_10e8,&local_10e9,(type *)0x0);
  std::__cxx11::string::~string(local_1110);
  std::allocator<char>::~allocator(&local_1111);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_10e8);
  if (!bVar2) {
    testing::Message::Message(&local_1120);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)((long)&file_11.field_0 + 0xe0),(internal *)local_10e8,
               (AssertionResult *)"database_->FindFileContainingSymbol(\"Baz\", &file)","true",
               "false",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1128,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database_unittest.cc"
               ,0x117,pcVar4);
    testing::internal::AssertHelper::operator=(&local_1128,&local_1120);
    testing::internal::AssertHelper::~AssertHelper(&local_1128);
    std::__cxx11::string::~string((string *)((long)&file_11.field_0 + 0xe0));
    testing::Message::~Message(&local_1120);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_10e8);
  FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)&gtest_ar__11.message_);
  FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)&gtest_ar__12.message_);
  pDVar1 = (this->super_DescriptorDatabaseTest).database_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1278,"Bar",&local_1279);
  iVar3 = (*pDVar1->_vptr_DescriptorDatabase[3])(pDVar1,local_1278,&gtest_ar__12.message_);
  local_1251 = (bool)(~(byte)iVar3 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1250,&local_1251,(type *)0x0);
  std::__cxx11::string::~string(local_1278);
  std::allocator<char>::~allocator(&local_1279);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1250);
  if (!bVar2) {
    testing::Message::Message(&local_1288);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_12b0,(internal *)local_1250,
               (AssertionResult *)"database_->FindFileContainingSymbol(\"Bar\", &file)","true",
               "false",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1290,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database_unittest.cc"
               ,0x11d,pcVar4);
    testing::internal::AssertHelper::operator=(&local_1290,&local_1288);
    testing::internal::AssertHelper::~AssertHelper(&local_1290);
    std::__cxx11::string::~string((string *)&local_12b0);
    testing::Message::~Message(&local_1288);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1250);
  FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)&gtest_ar__12.message_);
  return;
}

Assistant:

TEST_P(DescriptorDatabaseTest, FindFileContainingSymbol) {
  AddToDatabase(
      "name: \"foo.proto\" "
      "message_type { "
      "  name: \"Foo\" "
      "  field { name:\"qux\" }"
      "  nested_type { name: \"Grault\" } "
      "  enum_type { name: \"Garply\" } "
      "} "
      "enum_type { "
      "  name: \"Waldo\" "
      "  value { name:\"FRED\" } "
      "} "
      "extension { name: \"plugh\" } "
      "service { "
      "  name: \"Xyzzy\" "
      "  method { name: \"Thud\" } "
      "}");
  AddToDatabase(
      "name: \"bar.proto\" "
      "package: \"corge\" "
      "message_type { name: \"Bar\" }");

  {
    FileDescriptorProto file;
    EXPECT_TRUE(database_->FindFileContainingSymbol("Foo", &file));
    EXPECT_EQ("foo.proto", file.name());
  }

  {
    // Can find fields.
    FileDescriptorProto file;
    EXPECT_TRUE(database_->FindFileContainingSymbol("Foo.qux", &file));
    EXPECT_EQ("foo.proto", file.name());
    // Non-existent field under a valid top level symbol can also be
    // found.
    EXPECT_TRUE(
        database_->FindFileContainingSymbol("Foo.none_field.none", &file));
  }

  {
    // Can find nested types.
    FileDescriptorProto file;
    EXPECT_TRUE(database_->FindFileContainingSymbol("Foo.Grault", &file));
    EXPECT_EQ("foo.proto", file.name());
  }

  {
    // Can find nested enums.
    FileDescriptorProto file;
    EXPECT_TRUE(database_->FindFileContainingSymbol("Foo.Garply", &file));
    EXPECT_EQ("foo.proto", file.name());
  }

  {
    // Can find enum types.
    FileDescriptorProto file;
    EXPECT_TRUE(database_->FindFileContainingSymbol("Waldo", &file));
    EXPECT_EQ("foo.proto", file.name());
  }

  {
    // Can find enum values.
    FileDescriptorProto file;
    EXPECT_TRUE(database_->FindFileContainingSymbol("Waldo.FRED", &file));
    EXPECT_EQ("foo.proto", file.name());
  }

  {
    // Can find extensions.
    FileDescriptorProto file;
    EXPECT_TRUE(database_->FindFileContainingSymbol("plugh", &file));
    EXPECT_EQ("foo.proto", file.name());
  }

  {
    // Can find services.
    FileDescriptorProto file;
    EXPECT_TRUE(database_->FindFileContainingSymbol("Xyzzy", &file));
    EXPECT_EQ("foo.proto", file.name());
  }

  {
    // Can find methods.
    FileDescriptorProto file;
    EXPECT_TRUE(database_->FindFileContainingSymbol("Xyzzy.Thud", &file));
    EXPECT_EQ("foo.proto", file.name());
  }

  {
    // Can find things in packages.
    FileDescriptorProto file;
    EXPECT_TRUE(database_->FindFileContainingSymbol("corge.Bar", &file));
    EXPECT_EQ("bar.proto", file.name());
  }

  {
    // Fails to find undefined symbols.
    FileDescriptorProto file;
    EXPECT_FALSE(database_->FindFileContainingSymbol("Baz", &file));
  }

  {
    // Names must be fully-qualified.
    FileDescriptorProto file;
    EXPECT_FALSE(database_->FindFileContainingSymbol("Bar", &file));
  }
}